

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

int Cudd_ApaPrintMintermExp(FILE *fp,DdManager *dd,DdNode *node,int nvars,int precision)

{
  int iVar1;
  DdApaNumber number;
  DdApaNumber count;
  int result;
  int digits;
  int precision_local;
  int nvars_local;
  DdNode *node_local;
  DdManager *dd_local;
  FILE *fp_local;
  
  result = precision;
  digits = nvars;
  _precision_local = node;
  node_local = &dd->sentinel;
  dd_local = (DdManager *)fp;
  number = Cudd_ApaCountMinterm(dd,node,nvars,(int *)((long)&count + 4));
  if (number == (DdApaNumber)0x0) {
    fp_local._4_4_ = 0;
  }
  else {
    count._0_4_ = Cudd_ApaPrintExponential((FILE *)dd_local,count._4_4_,number,result);
    if (number != (DdApaNumber)0x0) {
      free(number);
    }
    iVar1 = fprintf((FILE *)dd_local,"\n");
    if (iVar1 == -1) {
      fp_local._4_4_ = 0;
    }
    else {
      fp_local._4_4_ = (int)count;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int
Cudd_ApaPrintMintermExp(
  FILE * fp,
  DdManager * dd,
  DdNode * node,
  int  nvars,
  int precision)
{
    int digits;
    int result;
    DdApaNumber count;

    count = Cudd_ApaCountMinterm(dd,node,nvars,&digits);
    if (count == NULL)
        return(0);
    result = Cudd_ApaPrintExponential(fp,digits,count,precision);
    ABC_FREE(count);
    if (fprintf(fp,"\n") == EOF) {
        return(0);
    }
    return(result);

}